

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O1

void loadShellData(QMultiHash<char,_QLatin1String> *types,QMultiHash<char,_QLatin1String> *keywords,
                  QMultiHash<char,_QLatin1String> *builtin,QMultiHash<char,_QLatin1String> *literals
                  ,QMultiHash<char,_QLatin1String> *other)

{
  if (shellDataInitialized == '\0') {
    initShellData();
    shellDataInitialized = '\x01';
  }
  QMultiHash<char,_QLatin1String>::operator=(types,&shell_types);
  QMultiHash<char,_QLatin1String>::operator=(keywords,&shell_keywords);
  QMultiHash<char,_QLatin1String>::operator=(builtin,&shell_builtin);
  QMultiHash<char,_QLatin1String>::operator=(literals,&shell_literals);
  QMultiHash<char,_QLatin1String>::operator=(other,&shell_other);
  return;
}

Assistant:

void loadShellData(QMultiHash<char, QLatin1String> &types,
                   QMultiHash<char, QLatin1String> &keywords,
                   QMultiHash<char, QLatin1String> &builtin,
                   QMultiHash<char, QLatin1String> &literals,
                   QMultiHash<char, QLatin1String> &other) {
    if (!shellDataInitialized) {
        initShellData();
        shellDataInitialized = true;
    }
    types = shell_types;
    keywords = shell_keywords;
    builtin = shell_builtin;
    literals = shell_literals;
    other = shell_other;
}